

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobVerificationManager.cxx
# Opt level: O1

void __thiscall cmGlobVerificationManager::Reset(cmGlobVerificationManager *this)

{
  std::
  _Rb_tree<cmGlobVerificationManager::CacheEntryKey,_std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>,_std::_Select1st<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>,_std::less<cmGlobVerificationManager::CacheEntryKey>,_std::allocator<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>_>
  ::clear((_Rb_tree<cmGlobVerificationManager::CacheEntryKey,_std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>,_std::_Select1st<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>,_std::less<cmGlobVerificationManager::CacheEntryKey>,_std::allocator<std::pair<const_cmGlobVerificationManager::CacheEntryKey,_cmGlobVerificationManager::CacheEntryValue>_>_>
           *)this);
  (this->VerifyScript)._M_string_length = 0;
  *(this->VerifyScript)._M_dataplus._M_p = '\0';
  (this->VerifyStamp)._M_string_length = 0;
  *(this->VerifyStamp)._M_dataplus._M_p = '\0';
  return;
}

Assistant:

void cmGlobVerificationManager::Reset()
{
  this->Cache.clear();
  this->VerifyScript.clear();
  this->VerifyStamp.clear();
}